

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O2

int Spl_ManFindOne(Spl_Man_t *p)

{
  Vec_Wec_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  
  for (iVar7 = 0; iVar7 < p->vNodes->nSize; iVar7 = iVar7 + 1) {
    pVVar1 = p->pGia->vMapping2;
    iVar2 = Vec_IntEntry(p->vNodes,iVar7);
    pVVar6 = Vec_WecEntry(pVVar1,iVar2);
    if (pVVar6 == (Vec_Int_t *)0x0) break;
    for (iVar2 = 0; iVar2 < pVVar6->nSize; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(pVVar6,iVar2);
      Gia_ObjLutRefDecId(p->pGia,iVar3);
    }
  }
  if (p->fReverse != 0) {
    pVVar6 = p->vNodes;
    uVar5 = pVVar6->nSize;
    if ((uVar5 & 1) != 0) {
      for (iVar7 = 0; iVar7 < (int)uVar5; iVar7 = iVar7 + 1) {
        iVar2 = Vec_IntEntry(pVVar6,iVar7);
        iVar3 = Gia_ObjLutRefNumId(p->pGia,iVar2);
        if (iVar3 != 0) {
          iVar3 = Gia_ObjLutRefNumId(p->pGia,iVar2);
          if (iVar3 < 1) {
            __assert_fail("Gia_ObjLutRefNumId(p->pGia, iObj) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                          ,0x162,"int Spl_ManFindOne(Spl_Man_t *)");
          }
          iVar3 = Gia_ObjLutRefNumId(p->pGia,iVar2);
          if (iVar3 < 5) {
            iVar3 = Spl_ManLutFanouts(p->pGia,iVar2,p->vFanouts,p->vMarksNo,p->vMarksCIO);
            iVar2 = Gia_ObjLutRefNumId(p->pGia,iVar2);
            if ((iVar2 == 1) && (iVar3 == 1)) goto LAB_0064427d;
          }
        }
        pVVar6 = p->vNodes;
        uVar5 = pVVar6->nSize;
      }
    }
  }
  p->vCands->nSize = 0;
  p->vInputs->nSize = 0;
  for (iVar7 = 0; iVar7 < p->vNodes->nSize; iVar7 = iVar7 + 1) {
    pVVar1 = p->pGia->vMapping2;
    iVar2 = Vec_IntEntry(p->vNodes,iVar7);
    pVVar6 = Vec_WecEntry(pVVar1,iVar2);
    if (pVVar6 == (Vec_Int_t *)0x0) break;
    for (iVar2 = 0; iVar2 < pVVar6->nSize; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(pVVar6,iVar2);
      iVar4 = Vec_BitEntry(p->vMarksNo,iVar3);
      if (((iVar4 == 0) && (iVar4 = Vec_BitEntry(p->vMarksCIO,iVar3), iVar4 == 0)) &&
         (iVar4 = Gia_ObjLutRefNumId(p->pGia,iVar3), iVar4 == 0)) {
        Vec_IntPush(p->vCands,iVar3);
        Vec_IntPush(p->vInputs,iVar3);
      }
    }
  }
  iVar7 = Spl_ManFindGoodCand(p);
  if (iVar7 != 0) goto LAB_0064428a;
  p->vCands->nSize = 0;
  p->vInputs->nSize = 0;
  for (iVar7 = 0; iVar7 < p->vNodes->nSize; iVar7 = iVar7 + 1) {
    pVVar1 = p->pGia->vMapping2;
    iVar2 = Vec_IntEntry(p->vNodes,iVar7);
    pVVar6 = Vec_WecEntry(pVVar1,iVar2);
    if (pVVar6 == (Vec_Int_t *)0x0) break;
    for (iVar2 = 0; iVar2 < pVVar6->nSize; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(pVVar6,iVar2);
      iVar4 = Vec_BitEntry(p->vMarksNo,iVar3);
      if ((iVar4 == 0) && (iVar4 = Vec_BitEntry(p->vMarksCIO,iVar3), iVar4 == 0)) {
        Vec_IntPush(p->vCands,iVar3);
        Vec_IntPush(p->vInputs,iVar3);
      }
    }
  }
  for (iVar7 = 0; iVar7 < p->vNodes->nSize; iVar7 = iVar7 + 1) {
    iVar2 = Vec_IntEntry(p->vNodes,iVar7);
    iVar3 = Gia_ObjLutRefNumId(p->pGia,iVar2);
    if (iVar3 != 0) {
      iVar3 = Gia_ObjLutRefNumId(p->pGia,iVar2);
      if (iVar3 < 1) {
        __assert_fail("Gia_ObjLutRefNumId(p->pGia, iObj) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                      ,0x18d,"int Spl_ManFindOne(Spl_Man_t *)");
      }
      iVar3 = Gia_ObjLutRefNumId(p->pGia,iVar2);
      if (iVar3 < 5) {
        iVar3 = Spl_ManLutFanouts(p->pGia,iVar2,p->vFanouts,p->vMarksNo,p->vMarksCIO);
        iVar2 = Gia_ObjLutRefNumId(p->pGia,iVar2);
        if ((iVar2 == 1) && (iVar3 == 1)) goto LAB_0064427d;
        Vec_IntAppend(p->vCands,p->vFanouts);
      }
    }
  }
  iVar7 = Spl_ManFindGoodCand(p);
  if (iVar7 != 0) goto LAB_0064428a;
  pVVar6 = p->vCands;
  if (pVVar6->nSize < 1) {
    iVar7 = 0;
    goto LAB_0064428a;
  }
LAB_00644281:
  iVar7 = Vec_IntEntry(pVVar6,0);
LAB_0064428a:
  iVar2 = 0;
  while( true ) {
    if (p->vNodes->nSize <= iVar2) {
      return iVar7;
    }
    pVVar1 = p->pGia->vMapping2;
    iVar3 = Vec_IntEntry(p->vNodes,iVar2);
    pVVar6 = Vec_WecEntry(pVVar1,iVar3);
    if (pVVar6 == (Vec_Int_t *)0x0) break;
    for (iVar3 = 0; iVar3 < pVVar6->nSize; iVar3 = iVar3 + 1) {
      iVar4 = Vec_IntEntry(pVVar6,iVar3);
      Gia_ObjLutRefIncId(p->pGia,iVar4);
    }
    iVar2 = iVar2 + 1;
  }
  return iVar7;
LAB_0064427d:
  pVVar6 = p->vFanouts;
  goto LAB_00644281;
}

Assistant:

int Spl_ManFindOne( Spl_Man_t * p )
{
    Vec_Int_t * vVec;
    int nFanouts, iObj, iFan, i, k;
    int Res = 0; 

    // deref
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            Gia_ObjLutRefDecId( p->pGia, iFan );

    // collect external nodes
    if ( p->fReverse && (Vec_IntSize(p->vNodes) & 1) )
    {
        Vec_IntForEachEntry( p->vNodes, iObj, i )
        {
            if ( Gia_ObjLutRefNumId(p->pGia, iObj) == 0 )
                continue;
            assert( Gia_ObjLutRefNumId(p->pGia, iObj) > 0 );
            if ( Gia_ObjLutRefNumId(p->pGia, iObj) >= 5 )  // skip nodes with high fanout!
                continue;
            nFanouts = Spl_ManLutFanouts( p->pGia, iObj, p->vFanouts, p->vMarksNo, p->vMarksCIO );
            if ( Gia_ObjLutRefNumId(p->pGia, iObj) == 1 && nFanouts == 1 )
            {
                Res = Vec_IntEntry(p->vFanouts, 0);
                goto finish;
            }
            //Vec_IntAppend( p->vCands, p->vFanouts );
        }
    }

    // consider LUT inputs - get one that has no refs
    Vec_IntClear( p->vCands );
    Vec_IntClear( p->vInputs );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            if ( !Vec_BitEntry(p->vMarksNo, iFan) && !Vec_BitEntry(p->vMarksCIO, iFan) && !Gia_ObjLutRefNumId(p->pGia, iFan) )
            {
                Vec_IntPush( p->vCands, iFan );
                Vec_IntPush( p->vInputs, iFan );
            }
    Res = Spl_ManFindGoodCand( p );
    if ( Res )
        goto finish;

    // collect candidates
    Vec_IntClear( p->vCands );
    Vec_IntClear( p->vInputs );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            if ( !Vec_BitEntry(p->vMarksNo, iFan) && !Vec_BitEntry(p->vMarksCIO, iFan) )
            {
                Vec_IntPush( p->vCands, iFan );
                Vec_IntPush( p->vInputs, iFan );
            }

    // all inputs have refs - collect external nodes
    Vec_IntForEachEntry( p->vNodes, iObj, i )
    {
        if ( Gia_ObjLutRefNumId(p->pGia, iObj) == 0 )
            continue;
        assert( Gia_ObjLutRefNumId(p->pGia, iObj) > 0 );
        if ( Gia_ObjLutRefNumId(p->pGia, iObj) >= 5 )  // skip nodes with high fanout!
            continue;
        nFanouts = Spl_ManLutFanouts( p->pGia, iObj, p->vFanouts, p->vMarksNo, p->vMarksCIO );
        if ( Gia_ObjLutRefNumId(p->pGia, iObj) == 1 && nFanouts == 1 )
        {
            Res = Vec_IntEntry(p->vFanouts, 0);
            goto finish;
        }
        Vec_IntAppend( p->vCands, p->vFanouts );
    }

    // choose among not-so-good ones
    Res = Spl_ManFindGoodCand( p );
    if ( Res )
        goto finish;

    // get the first candidate
    if ( Res == 0 && Vec_IntSize(p->vCands) > 0 )
        Res = Vec_IntEntry( p->vCands, 0 );

finish:
    // ref
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            Gia_ObjLutRefIncId( p->pGia, iFan );
    return Res;
}